

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

void __thiscall
amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
          (FabArray<amrex::FArrayBox> *this,int scomp,int ncomp,IntVect *nghost,Periodicity *period,
          bool cross)

{
  undefined8 uVar1;
  FabArray<amrex::FArrayBox> *in_RCX;
  FabArray<amrex::FArrayBox> *in_RDI;
  byte in_R9B;
  IntVect IVar2;
  int r;
  char *in_stack_00000138;
  int in_stack_00000144;
  char *in_stack_00000148;
  char *in_stack_00000150;
  BATType local_e0;
  FabArray<amrex::FArrayBox> *this_00;
  bool local_b1;
  undefined8 local_b0;
  int local_a8;
  undefined8 local_a0;
  int local_98;
  byte local_91;
  FabArray<amrex::FArrayBox> *local_88;
  undefined8 *local_70;
  undefined4 local_5c;
  undefined8 *local_58;
  undefined4 local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  undefined8 *local_38;
  char *local_30;
  undefined4 local_24;
  char *local_20;
  char *local_18;
  BATType local_c;
  FabArray<amrex::FArrayBox> *local_8;
  
  local_91 = in_R9B & 1;
  local_88 = in_RCX;
  IVar2 = FabArrayBase::nGrowVect(&in_RDI->super_FabArrayBase);
  local_b0 = IVar2.vect._0_8_;
  local_a0 = local_b0;
  uVar1 = local_a0;
  local_a8 = IVar2.vect[2];
  local_98 = local_a8;
  local_70 = &local_a0;
  local_3c = 0;
  local_a0._0_4_ = IVar2.vect[0];
  local_b1 = false;
  if (*(int *)&(in_RCX->super_FabArrayBase)._vptr_FabArrayBase <= (int)local_a0) {
    local_4c = 1;
    local_a0._4_4_ = IVar2.vect[1];
    local_b1 = false;
    local_48 = local_70;
    if (*(int *)((long)&(in_RCX->super_FabArrayBase)._vptr_FabArrayBase + 4) <= local_a0._4_4_) {
      local_5c = 2;
      local_b1 = (int)(in_RCX->super_FabArrayBase).boxarray.m_bat.m_bat_type <= local_a8;
      local_58 = local_70;
    }
  }
  this_00 = in_RCX;
  local_a0 = uVar1;
  local_38 = local_70;
  if (!local_b1) {
    local_18 = "nghost.allLE(nGrowVect())";
    local_20 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_FabArray.H"
    ;
    local_24 = 0xa60;
    local_30 = "\"FillBoundary: asked to fill more ghost cells than we have\"";
    Assert_host(in_stack_00000150,in_stack_00000148,in_stack_00000144,in_stack_00000138);
  }
  local_8 = local_88;
  if (*(int *)((long)&(local_88->super_FabArrayBase)._vptr_FabArrayBase + 4) <
      *(int *)&(local_88->super_FabArrayBase)._vptr_FabArrayBase) {
    local_c = *(BATType *)&(local_88->super_FabArrayBase)._vptr_FabArrayBase;
  }
  else {
    local_c = *(BATType *)((long)&(local_88->super_FabArrayBase)._vptr_FabArrayBase + 4);
  }
  local_e0 = local_c;
  if ((int)local_c <= (int)(local_88->super_FabArrayBase).boxarray.m_bat.m_bat_type) {
    local_e0 = (local_88->super_FabArrayBase).boxarray.m_bat.m_bat_type;
  }
  if (0 < (int)local_e0) {
    FillBoundary_nowait<double>
              (this_00,(int)((ulong)in_RCX >> 0x20),(int)in_RCX,(IntVect *)in_RDI,
               (Periodicity *)local_88,SUB41(local_c >> 0x18,0));
    FillBoundary_finish<double,_amrex::FArrayBox,_0>(in_RDI);
  }
  return;
}

Assistant:

void
FabArray<FAB>::FillBoundary (int scomp, int ncomp, const IntVect& nghost,
                             const Periodicity& period, bool cross)
{
    BL_PROFILE("FabArray::FillBoundary()");
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(nghost.allLE(nGrowVect()),
                                     "FillBoundary: asked to fill more ghost cells than we have");
    if ( nghost.max() > 0 ) {
        FillBoundary_nowait<BUF>(scomp, ncomp, nghost, period, cross);
        FillBoundary_finish<BUF>();
    }
}